

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O3

void __thiscall tlx::CmdlineParser::ArgumentString::print_value(ArgumentString *this,ostream *os)

{
  ostream *poVar1;
  char local_12;
  char local_11;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_12,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->dest_->_M_dataplus)._M_p,this->dest_->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_11,1);
  return;
}

Assistant:

void print_value(std::ostream& os) const final {
        os << '"' << dest_ << '"';
    }